

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::on_error(session_impl *this,error_code *ec)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 local_40 [4];
  
  iVar2 = (**ec->cat_->_vptr_error_category)();
  uVar1 = ec->val_;
  (*ec->cat_->_vptr_error_category[4])((string *)local_40,ec->cat_,(ulong)uVar1);
  session_log(this,"FATAL SESSION ERROR (%s : %d) [%s]",CONCAT44(extraout_var,iVar2),(ulong)uVar1,
              local_40[0]);
  ::std::__cxx11::string::~string((string *)local_40);
  abort(this);
  return;
}

Assistant:

void session_impl::on_error(error_code const& ec)
	{
		TORRENT_UNUSED(ec);
#ifndef TORRENT_DISABLE_LOGGING
		session_log("FATAL SESSION ERROR (%s : %d) [%s]"
			, ec.category().name(), ec.value(), ec.message().c_str());
#endif
		this->abort();
	}